

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OISInputManager.cpp
# Opt level: O1

void __thiscall OIS::InputManager::destroyInputObject(InputManager *this,Object *obj)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  undefined8 *puVar3;
  _Base_ptr p_Var4;
  iterator __position;
  
  if (obj == (Object *)0x0) {
    return;
  }
  p_Var1 = &(this->mFactoryObjects)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->mFactoryObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(Object **)(p_Var2 + 1) < obj]) {
    if (*(Object **)(p_Var2 + 1) >= obj) {
      p_Var4 = p_Var2;
    }
  }
  __position._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (__position._M_node = p_Var4, obj < *(Object **)(p_Var4 + 1))) {
    __position._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    (**(code **)(*(long *)__position._M_node[1]._M_parent + 0x38))();
    std::
    _Rb_tree<OIS::Object*,std::pair<OIS::Object*const,OIS::FactoryCreator*>,std::_Select1st<std::pair<OIS::Object*const,OIS::FactoryCreator*>>,std::less<OIS::Object*>,std::allocator<std::pair<OIS::Object*const,OIS::FactoryCreator*>>>
    ::erase_abi_cxx11_((_Rb_tree<OIS::Object*,std::pair<OIS::Object*const,OIS::FactoryCreator*>,std::_Select1st<std::pair<OIS::Object*const,OIS::FactoryCreator*>>,std::less<OIS::Object*>,std::allocator<std::pair<OIS::Object*const,OIS::FactoryCreator*>>>
                        *)&this->mFactoryObjects,__position);
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x20);
  *puVar3 = &PTR__exception_00123860;
  puVar3[1] = 0xf500000008;
  puVar3[2] = 
  "/workspace/llm4binary/github/license_c_cmakelists/wgois[P]OIS/src/OISInputManager.cpp";
  puVar3[3] = "Object creator not known.";
  __cxa_throw(puVar3,&Exception::typeinfo,std::exception::~exception);
}

Assistant:

void InputManager::destroyInputObject(Object* obj)
{
	if(obj == nullptr)
		return;

	FactoryCreatedObject::iterator i = mFactoryObjects.find(obj);
	if(i != mFactoryObjects.end())
	{
		i->second->destroyObject(obj);
		mFactoryObjects.erase(i);
	}
	else
	{
		OIS_EXCEPT(E_General, "Object creator not known.");
	}
}